

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# siamese.cpp
# Opt level: O1

SiameseResult siamese_decoder_is_ready(SiameseDecoder decoder_t)

{
  bool bVar1;
  SiameseResult SVar2;
  Decoder *decoder;
  
  if (decoder_t != (SiameseDecoder)0x0) {
    SVar2 = Siamese_Success;
    if (decoder_t[0x790] == (SiameseDecoderImpl)0x0) {
      bVar1 = siamese::Decoder::CheckRecoveryPossible((Decoder *)decoder_t);
      SVar2 = (uint)!bVar1 * 2;
    }
    return SVar2;
  }
  return Siamese_InvalidInput;
}

Assistant:

SIAMESE_EXPORT SiameseResult siamese_decoder_is_ready(
    SiameseDecoder decoder_t)
{
    siamese::Decoder* decoder = reinterpret_cast<siamese::Decoder*>(decoder_t);
    if (!decoder)
        return Siamese_InvalidInput;

    return decoder->IsReadyToDecode();
}